

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

bucket bucket_create(size_t size)

{
  ulong in_RDI;
  size_t iterator;
  bucket buckets;
  ulong local_20;
  bucket local_8;
  
  if (in_RDI == 0) {
    log_write_impl_va("metacall",0x7b,"bucket_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,"Invalid bucket size: %zu");
    local_8 = (bucket)0x0;
  }
  else {
    local_8 = (bucket)malloc(in_RDI * 0x18);
    if (local_8 == (bucket)0x0) {
      log_write_impl_va("metacall",0x83,"bucket_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                        ,3,"Bad allocation for bucket");
      local_8 = (bucket)0x0;
    }
    else {
      for (local_20 = 0; local_20 < in_RDI; local_20 = local_20 + 1) {
        local_8[local_20].count = 0;
        local_8[local_20].capacity = 0;
        local_8[local_20].pairs = (pair)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

bucket bucket_create(size_t size)
{
	bucket buckets;

	size_t iterator;

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket size: %" PRIuS, size);
		return NULL;
	}

	buckets = malloc(sizeof(struct bucket_type) * size);

	if (buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad allocation for bucket");
		return NULL;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		buckets[iterator].count = 0;
		buckets[iterator].capacity = 0;
		buckets[iterator].pairs = NULL;
	}

	return buckets;
}